

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons6.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  pthread_t *__newthread;
  uint *__arg;
  pthread_t tid_consumer;
  int count [64];
  pthread_t tid_producer [64];
  pthread_t local_340;
  uint local_338 [64];
  pthread_t local_238 [65];
  
  if (argc != 3) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
           );
    err_quit("usage: prodcons2 [nitems] [nthreads]");
  }
  uVar1 = atoi(argv[1]);
  if (999999 < (int)uVar1) {
    uVar1 = 1000000;
  }
  nitems = uVar1;
  uVar2 = atoi(argv[2]);
  uVar4 = 0x40;
  if ((int)uVar2 < 0x40) {
    uVar4 = uVar2;
  }
  printf("nitems = %d, nthreads = %d\n",(ulong)uVar1,(ulong)uVar4);
  if (999999 < nitems - 1U) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
           );
    err_quit("nitems = %d");
  }
  if ((int)uVar2 < 1) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
           );
    err_quit("nthreads = %d");
  }
  uVar5 = (ulong)uVar4;
  if (0 < (int)uVar2) {
    __newthread = local_238;
    __arg = local_338;
    uVar6 = 0;
    do {
      *__arg = 0;
      iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,producer,__arg);
      if (iVar3 != 0) {
        fprintf(_stderr,"[%s:%d]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
               );
        err_quit("Failed to create thread %d");
      }
      uVar6 = uVar6 + 1;
      __newthread = __newthread + 1;
      __arg = __arg + 1;
    } while (uVar5 != uVar6);
  }
  iVar3 = pthread_create(&local_340,(pthread_attr_t *)0x0,consumer,(void *)0x0);
  if (iVar3 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x5c);
    err_quit("Failed to create consumer thread");
  }
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      iVar3 = pthread_join(local_238[uVar6],(void **)0x0);
      if (iVar3 != 0) {
        fprintf(_stderr,"[%s:%d]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
                ,0x60);
        err_quit("Failed to join thread %d(tid = %ld)",uVar6 & 0xffffffff,local_238[uVar6]);
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  uVar1 = 0;
  if (0 < (int)uVar2) {
    uVar6 = 0;
    uVar1 = 0;
    do {
      printf("tid_producer[%d] = %ld, count[%d] = %d\n",uVar6 & 0xffffffff,local_238[uVar6],
             uVar6 & 0xffffffff,(ulong)local_338[uVar6]);
      uVar1 = uVar1 + local_338[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  printf("sum = %d, nitems = %d\n",(ulong)uVar1,(ulong)(uint)nitems);
  iVar3 = pthread_join(local_340,(void **)0x0);
  if (iVar3 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
            ,0x6c);
    err_quit("Failed to join consumer thread (tid = %ld)",local_340);
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv) {
    int nthreads, i, count[MAX_THREADS];
    pthread_t tid_producer[MAX_THREADS], tid_consumer;

    ASSERT_ERR_QUIT(3 == argc, "usage: prodcons2 [nitems] [nthreads]");

    nitems = min(atoi(argv[1]), MAX_ITEMS);
    nthreads = min(atoi(argv[2]), MAX_THREADS);

    printf("nitems = %d, nthreads = %d\n", nitems, nthreads);

    ASSERT_ERR_QUIT(nitems > 0 && nitems <= MAX_ITEMS, "nitems = %d", nitems);
    ASSERT_ERR_QUIT(nthreads > 0 && nthreads <= MAX_THREADS, 
        "nthreads = %d", nthreads);

    for (i = 0; i < nthreads; ++i) {
        count[i] = 0;
        ASSERT_ERR_QUIT(0 == pthread_create(&tid_producer[i], NULL,
            &producer, &count[i]), "Failed to create thread %d", i);
    }

    ASSERT_ERR_QUIT(0 == pthread_create(&tid_consumer, NULL, &consumer, NULL),
        "Failed to create consumer thread");

    for (i = 0; i < nthreads; ++i) {
        ASSERT_ERR_QUIT(0 == pthread_join(tid_producer[i], NULL), 
            "Failed to join thread %d(tid = %ld)", i, (long)(tid_producer[i]));
    }

    int sum = 0;
    for (i = 0; i < nthreads; ++i) {
        printf("tid_producer[%d] = %ld, count[%d] = %d\n", i, (long)(tid_producer[i]), i, count[i]);
        sum += count[i];
    }

    printf("sum = %d, nitems = %d\n", sum, nitems);

    ASSERT_ERR_QUIT(0 == pthread_join(tid_consumer, NULL), "Failed to join "
        "consumer thread (tid = %ld)", (long)tid_consumer);
    
    exit(0);
}